

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O2

void cf_hash_drbg_sha256_gen_additional
               (cf_hash_drbg_sha256 *ctx,void *addnl,size_t naddnl,void *out,size_t nout)

{
  uint uVar1;
  code *pcVar2;
  code *nin;
  size_t __y_1;
  ulong uVar3;
  size_t __x;
  ulong __n;
  uint8_t three;
  uint local_25c;
  void *local_258;
  code *local_250;
  code *local_248;
  code *local_240;
  ulong local_238;
  uint8_t *local_230;
  cf_hash_drbg_sha256 *local_228;
  ulong local_220;
  uint8_t two;
  undefined3 uStack_217;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined7 uStack_1f0;
  undefined1 uStack_1e9;
  undefined7 uStack_1e8;
  uint8_t w [64];
  cf_chash_ctx ctx_1;
  
  local_240 = cf_sha256_init;
  nin = cf_sha256_update;
  local_250 = cf_sha256_update;
  local_248 = cf_sha256_digest;
  local_230 = ctx->C;
  local_228 = ctx;
  while( true ) {
    if (nout == 0) {
      return;
    }
    local_238 = 0x10000;
    if (nout < 0x10000) {
      local_238 = nout;
    }
    if (ctx->reseed_counter == 0) break;
    local_220 = nout;
    if (naddnl != 0) {
      _two = CONCAT31(uStack_217,2);
      local_258 = (void *)naddnl;
      (*local_240)(&ctx_1);
      pcVar2 = local_250;
      (*local_250)(&ctx_1,&two,1);
      (*pcVar2)(&ctx_1,ctx,0x37);
      (*pcVar2)(&ctx_1,addnl,(size_t)local_258);
      (*local_248)(&ctx_1,w);
      add(ctx->V,(size_t)w,(uint8_t *)0x20,(size_t)nin);
    }
    uStack_1e8 = (undefined7)((ulong)*(undefined8 *)(ctx->V + 0x2f) >> 8);
    _two = *(undefined4 *)ctx->V;
    uStack_214 = *(undefined4 *)(ctx->V + 4);
    uStack_210 = *(undefined4 *)(ctx->V + 8);
    uStack_20c = *(undefined4 *)(ctx->V + 0xc);
    local_208 = *(undefined8 *)(ctx->V + 0x10);
    uStack_200 = *(undefined8 *)(ctx->V + 0x18);
    local_1f8 = *(undefined8 *)(ctx->V + 0x20);
    uStack_1f0 = (undefined7)*(undefined8 *)(ctx->V + 0x28);
    uStack_1e9 = (undefined1)((ulong)*(undefined8 *)(ctx->V + 0x28) >> 0x38);
    local_25c = CONCAT31(local_25c._1_3_,1);
    local_258 = out;
    for (uVar3 = local_238; uVar3 != 0; uVar3 = uVar3 - __n) {
      (*local_240)(&ctx_1);
      (*local_250)(&ctx_1,&two,0x37);
      (*local_248)(&ctx_1,w);
      __n = uVar3;
      if (0x20 < uVar3) {
        __n = 0x20;
      }
      memcpy(out,w,__n);
      out = (void *)((long)out + __n);
      add(&two,(size_t)&local_25c,(uint8_t *)0x1,(size_t)nin);
    }
    three = '\x03';
    (*local_240)(&ctx_1);
    pcVar2 = local_250;
    (*local_250)(&ctx_1,&three,1);
    ctx = local_228;
    (*pcVar2)(&ctx_1,local_228,0x37);
    (*local_248)(&ctx_1,w);
    uVar1 = ctx->reseed_counter;
    local_25c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    add(ctx->V,(size_t)w,(uint8_t *)0x20,(size_t)nin);
    add(ctx->V,(size_t)local_230,(uint8_t *)0x37,(size_t)nin);
    add(ctx->V,(size_t)&local_25c,(uint8_t *)0x4,(size_t)nin);
    ctx->reseed_counter = ctx->reseed_counter + 1;
    out = (void *)((long)local_258 + local_238);
    nout = local_220 - local_238;
    naddnl = 0;
    addnl = (void *)0x0;
  }
  abort();
}

Assistant:

void cf_hash_drbg_sha256_gen_additional(cf_hash_drbg_sha256 *ctx,
                                        const void *addnl, size_t naddnl,
                                        void *out, size_t nout)
{
  uint8_t *bout = out;

  /* Generate output in requests of MAX_DRBG_GENERATE in size. */
  while (nout != 0)
  {
    size_t take = MIN(MAX_DRBG_GENERATE, nout);
    hash_gen_request(ctx, addnl, naddnl, bout, take);
    bout += take;
    nout -= take;

    /* Add additional data only once. */
    addnl = NULL;
    naddnl = 0;
  }
}